

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  byte bVar1;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  _Var2;
  LogMessage *pLVar3;
  _Base_ptr p_Var4;
  int iVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar6;
  LogFinisher local_61;
  LogMessage local_60;
  
  local_60.filename_ = (char *)0x0;
  local_60.line_ = 0;
  local_60._20_4_ = 0;
  local_60.message_._M_dataplus._M_p = (pointer)0x0;
  local_60.level_ = number;
  pVar6 = std::
          _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
          ::_M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                    ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                      *)this,(pair<int,_google::protobuf::internal::ExtensionSet::Extension> *)
                             &local_60);
  _Var2 = pVar6.first._M_node;
  _Var2._M_node[1]._M_right = (_Base_ptr)descriptor;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(char *)((long)&_Var2._M_node[1]._M_left + 1) == '\0') {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x170);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                         );
      LogFinisher::operator=(&local_61,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    bVar1 = *(byte *)&_Var2._M_node[1]._M_left;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x35);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_61,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 8) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x170);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_61,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    if ((bool)*(char *)((long)&_Var2._M_node[1]._M_left + 3) != packed) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x171);
      pLVar3 = LogMessage::operator<<
                         (&local_60,"CHECK failed: (extension->is_packed) == (packed): ");
      LogFinisher::operator=(&local_61,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
  }
  else {
    *(FieldType *)&_Var2._M_node[1]._M_left = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x35);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_61,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 8) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x16b);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_61,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    *(undefined1 *)((long)&_Var2._M_node[1]._M_left + 1) = 1;
    *(bool *)((long)&_Var2._M_node[1]._M_left + 3) = packed;
    p_Var4 = (_Base_ptr)operator_new(0x10);
    *(undefined8 *)p_Var4 = 0;
    p_Var4->_M_parent = (_Base_ptr)0x0;
    _Var2._M_node[1]._M_parent = p_Var4;
  }
  p_Var4 = _Var2._M_node[1]._M_parent;
  iVar5 = *(int *)&p_Var4->_M_parent;
  if (iVar5 == *(int *)((long)&p_Var4->_M_parent + 4)) {
    RepeatedField<int>::Reserve((RepeatedField<int> *)p_Var4,iVar5 + 1);
    iVar5 = *(int *)&p_Var4->_M_parent;
  }
  *(int *)&p_Var4->_M_parent = iVar5 + 1;
  *(int *)(*(long *)p_Var4 + (long)iVar5 * 4) = value;
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type,
                           bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value = new RepeatedField<int>();
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}